

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O3

string * __thiscall
AutoArgParse::MissingMandatoryArgException::makeErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,MissingMandatoryArgException *this,FlagStore *flagStore)

{
  ostringstream os;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Missing mandatory argument(s).  Valid option(s) are: ",0x35);
  printUnParsed((ostringstream *)local_190,
                (ArgVector *)&this[2].super_ParseException.errorMessage.field_2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeErrorMessage(const FlagStore& flagStore) {
        std::ostringstream os;
        os << "Missing mandatory argument(s).  Valid option(s) are: ";
        printUnParsed(os, flagStore.args);
        return os.str();
    }